

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O3

void mqc_destroy(opj_mqc_t *mqc)

{
  if (mqc == (opj_mqc_t *)0x0) {
    return;
  }
  free(mqc);
  return;
}

Assistant:

void mqc_destroy(opj_mqc_t *mqc) {
	if(mqc) {
#ifdef MQC_PERF_OPT
		if (mqc->buffer) {
			opj_free(mqc->buffer);
		}
#endif
		opj_free(mqc);
	}
}